

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::MILSpec::ListType::ByteSizeLong(ListType *this)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  
  if (this->type_ == (ValueType *)0x0 || this == (ListType *)_ListType_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = ValueType::ByteSizeLong(this->type_);
    uVar5 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->length_ != (Dimension *)0x0 && this != (ListType *)_ListType_default_instance_) {
    sVar4 = Dimension::ByteSizeLong(this->length_);
    uVar5 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t ListType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.ListType)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.ValueType type = 1;
  if (this->_internal_has_type()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *type_);
  }

  // .CoreML.Specification.MILSpec.Dimension length = 2;
  if (this->_internal_has_length()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *length_);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}